

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottieitem.cpp
# Opt level: O1

void __thiscall
rlottie::internal::renderer::Shape::update
          (Shape *this,int frameNo,VMatrix *param_2,float param_3,DirtyFlag *flag)

{
  uint uVar1;
  VPath VVar2;
  int iVar3;
  type tmp;
  VPath local_38;
  vcow_ptr<VPath::VPathData> local_30;
  
  this->mDirtyPath = false;
  uVar1 = this->mFrameNo;
  this->mFrameNo = frameNo;
  if (uVar1 != 0xffffffff) {
    if ((uVar1 == frameNo) || (this->mStaticPath != false)) goto LAB_0012a61a;
    iVar3 = (*(this->super_Object)._vptr_Object[7])(this,(ulong)uVar1,frameNo);
    if ((char)iVar3 == '\0') goto LAB_0012a61a;
  }
  local_38.d.mModel = (vcow_ptr<VPath::VPathData>)(model *)0x0;
  vcow_ptr<VPath::VPathData>::vcow_ptr(&local_38.d);
  VVar2.d.mModel = local_38.d.mModel;
  local_38.d.mModel = (vcow_ptr<VPath::VPathData>)(model *)0x0;
  local_30.mModel = (this->mTemp).d.mModel;
  (this->mTemp).d.mModel = (model *)VVar2.d.mModel;
  vcow_ptr<VPath::VPathData>::~vcow_ptr(&local_30);
  vcow_ptr<VPath::VPathData>::~vcow_ptr(&local_38.d);
  (*(this->super_Object)._vptr_Object[6])(this,&this->mLocalPath,frameNo);
  this->mDirtyPath = true;
LAB_0012a61a:
  vcow_ptr<VPath::VPathData>::operator=(&(this->mTemp).d,&(this->mLocalPath).d);
  if ((flag->i & 1) != 0) {
    this->mDirtyPath = true;
  }
  return;
}

Assistant:

void renderer::Shape::update(int              frameNo, const VMatrix &, float,
                             const DirtyFlag &flag)
{
    mDirtyPath = false;

    // 1. update the local path if needed
    if (hasChanged(frameNo)) {
        // loose the reference to mLocalPath if any
        // from the last frame update.
        mTemp = VPath();

        updatePath(mLocalPath, frameNo);
        mDirtyPath = true;
    }
    // 2. keep a reference path in temp in case there is some
    // path operation like trim which will update the path.
    // we don't want to update the local path.
    mTemp = mLocalPath;

    // 3. mark the path dirty if matrix has changed.
    if (flag & DirtyFlagBit::Matrix) {
        mDirtyPath = true;
    }
}